

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O0

int Gia_WinTryAddingNode(Gia_Man_t *p,int iPivot,int iPivot2,Vec_Wec_t *vLevels,Vec_Int_t *vNodes)

{
  int iVar1;
  int Entry;
  Vec_Int_t *pVVar2;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  int local_50;
  int local_4c;
  int Count;
  int f;
  int i;
  int k;
  Gia_Obj_t *pFanout;
  Gia_Obj_t *pObj;
  Vec_Int_t *vLevel;
  Vec_Int_t *vNodes_local;
  Vec_Wec_t *vLevels_local;
  int iPivot2_local;
  int iPivot_local;
  Gia_Man_t *p_local;
  
  local_50 = 0;
  iVar1 = Vec_WecSizeSize(vLevels);
  if (iVar1 != 0) {
    __assert_fail("Vec_WecSizeSize(vLevels) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                  ,0x23e,"int Gia_WinTryAddingNode(Gia_Man_t *, int, int, Vec_Wec_t *, Vec_Int_t *)"
                 );
  }
  iVar1 = Gia_ObjIsTravIdCurrentId(p,iPivot);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrentId(p,iPivot);
    iVar1 = Gia_ObjLevelId(p,iPivot);
    Vec_WecPush(vLevels,iVar1,iPivot);
    if (iPivot2 != -1) {
      iVar1 = Gia_ObjIsTravIdCurrentId(p,iPivot2);
      if (iVar1 != 0) {
        __assert_fail("!Gia_ObjIsTravIdCurrentId(p, iPivot2)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                      ,0x248,
                      "int Gia_WinTryAddingNode(Gia_Man_t *, int, int, Vec_Wec_t *, Vec_Int_t *)");
      }
      Gia_ObjSetTravIdCurrentId(p,iPivot2);
      iVar1 = Gia_ObjLevelId(p,iPivot2);
      Vec_WecPush(vLevels,iVar1,iPivot2);
    }
    for (f = 0; iVar1 = Vec_WecSize(vLevels), f < iVar1; f = f + 1) {
      pVVar2 = Vec_WecEntry(vLevels,f);
      Count = 0;
      while( true ) {
        iVar1 = Vec_IntSize(pVVar2);
        bVar4 = false;
        if (Count < iVar1) {
          iVar1 = Vec_IntEntry(pVVar2,Count);
          pFanout = Gia_ManObj(p,iVar1);
          bVar4 = pFanout != (Gia_Obj_t *)0x0;
        }
        if (!bVar4) break;
        for (local_4c = 0;
            (iVar1 = Gia_ObjFanoutNum(p,pFanout), local_4c < iVar1 &&
            (pObj_00 = Gia_ObjFanout(p,pFanout,local_4c), local_4c != 5)); local_4c = local_4c + 1)
        {
          iVar1 = Gia_ObjIsAnd(pObj_00);
          if ((iVar1 != 0) && (iVar1 = Gia_ObjIsTravIdCurrent(p,pObj_00), iVar1 == 0)) {
            pGVar3 = Gia_ObjFanin0(pObj_00);
            iVar1 = Gia_ObjIsTravIdCurrent(p,pGVar3);
            if (iVar1 != 0) {
              pGVar3 = Gia_ObjFanin1(pObj_00);
              iVar1 = Gia_ObjIsTravIdCurrent(p,pGVar3);
              if (iVar1 != 0) {
                Gia_ObjSetTravIdCurrent(p,pObj_00);
                iVar1 = Gia_ObjLevel(p,pObj_00);
                Entry = Gia_ObjId(p,pObj_00);
                Vec_WecPush(vLevels,iVar1,Entry);
                local_50 = local_50 + 1;
              }
            }
          }
        }
        Count = Count + 1;
      }
    }
    for (f = 0; iVar1 = Vec_WecSize(vLevels), f < iVar1; f = f + 1) {
      pVVar2 = Vec_WecEntry(vLevels,f);
      Count = 0;
      while( true ) {
        iVar1 = Vec_IntSize(pVVar2);
        bVar4 = false;
        if (Count < iVar1) {
          iVar1 = Vec_IntEntry(pVVar2,Count);
          pFanout = Gia_ManObj(p,iVar1);
          bVar4 = pFanout != (Gia_Obj_t *)0x0;
        }
        if (!bVar4) break;
        if (vNodes == (Vec_Int_t *)0x0) {
          Gia_ObjSetTravIdPrevious(p,pFanout);
        }
        else {
          iVar1 = Gia_ObjId(p,pFanout);
          Vec_IntPush(vNodes,iVar1);
        }
        Count = Count + 1;
      }
      Vec_IntClear(pVVar2);
    }
    return local_50;
  }
  __assert_fail("!Gia_ObjIsTravIdCurrentId(p, iPivot)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                ,0x240,"int Gia_WinTryAddingNode(Gia_Man_t *, int, int, Vec_Wec_t *, Vec_Int_t *)");
}

Assistant:

int Gia_WinTryAddingNode( Gia_Man_t * p, int iPivot, int iPivot2, Vec_Wec_t * vLevels, Vec_Int_t * vNodes )
{
    Vec_Int_t * vLevel; 
    Gia_Obj_t * pObj, * pFanout;
    int k, i, f, Count = 0;
    // precondition:  the levelized structure is empty
    assert( Vec_WecSizeSize(vLevels) == 0 );
    // precondition:  the new object to be added (iPivot) is not in the window
    assert( !Gia_ObjIsTravIdCurrentId(p, iPivot) );
    // add the object to the window and to the levelized structure
    Gia_ObjSetTravIdCurrentId( p, iPivot );
    Vec_WecPush( vLevels, Gia_ObjLevelId(p, iPivot), iPivot );
    // the same about the second node if it is given
    if ( iPivot2 != -1 )
    {
        // precondition:  the new object to be added (iPivot2) is not in the window
        assert( !Gia_ObjIsTravIdCurrentId(p, iPivot2) );
        // add the object to the window and to the levelized structure
        Gia_ObjSetTravIdCurrentId( p, iPivot2 );
        Vec_WecPush( vLevels, Gia_ObjLevelId(p, iPivot2), iPivot2 );
    }
    // iterate through all objects and explore their fanouts
    Vec_WecForEachLevel( vLevels, vLevel, k )
        Gia_ManForEachObjVec( vLevel, p, pObj, i )
            Gia_ObjForEachFanoutStatic( p, pObj, pFanout, f )
            {
                if ( f == 5 ) // explore first 5 fanouts of the node
                    break;
                if ( Gia_ObjIsAnd(pFanout) && // internal node
                    !Gia_ObjIsTravIdCurrent(p, pFanout) && // not in the window
                     Gia_ObjIsTravIdCurrent(p, Gia_ObjFanin0(pFanout)) && // but fanins are
                     Gia_ObjIsTravIdCurrent(p, Gia_ObjFanin1(pFanout)) )  // in the window
                {
                    // add fanout to the window and to the levelized structure
                    Gia_ObjSetTravIdCurrent( p, pFanout );
                    Vec_WecPush( vLevels, Gia_ObjLevel(p, pFanout), Gia_ObjId(p, pFanout) );
                    // count the number of nodes in the structure
                    Count++;
                }
            }
    // iterate through the nodes in the levelized structure
    Vec_WecForEachLevel( vLevels, vLevel, k )
    {
        Gia_ManForEachObjVec( vLevel, p, pObj, i )
            if ( vNodes == NULL ) // it was a test run - unmark the node
                Gia_ObjSetTravIdPrevious( p, pObj );
            else // it was a real run - permanently add to the node to the window
                Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
        // clean the levelized structure
        Vec_IntClear( vLevel );
    }
    // return the number of nodes to be added
    return Count;
}